

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O2

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,WhileStatement *while_stmt,void *data)

{
  SyntaxTree *pSVar1;
  Function *this_00;
  uint uVar2;
  size_t sVar3;
  ExpVarData_conflict exp_var_data;
  Guard l;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  Guard g;
  
  l.leave_.super__Function_base._M_functor._8_8_ = 0;
  l.leave_._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:810:9)>
       ::_M_invoke;
  l.leave_.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:810:9)>
       ::_M_manager;
  exp_var_data = (ExpVarData_conflict)this;
  l.leave_.super__Function_base._M_functor._M_unused._M_object = this;
  Guard::Guard(&g,&l.leave_,(function<void_()> *)&exp_var_data);
  std::_Function_base::~_Function_base((_Function_base *)&exp_var_data);
  std::_Function_base::~_Function_base((_Function_base *)&l);
  local_60._8_8_ = 0;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:811:9)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:811:9)>
             ::_M_manager;
  exp_var_data = (ExpVarData_conflict)this;
  local_60._M_unused._M_object = this;
  Guard::Guard(&l,(function<void_()> *)&exp_var_data,(function<void_()> *)&local_60);
  std::_Function_base::~_Function_base((_Function_base *)&local_60);
  std::_Function_base::~_Function_base((_Function_base *)&exp_var_data);
  uVar2 = GenerateRegisterId(this);
  exp_var_data.end_register_ = uVar2 + 1;
  exp_var_data.start_register_ = uVar2;
  pSVar1 = (while_stmt->exp_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this);
  this_00 = this->current_function_->function_;
  sVar3 = Function::AddInstruction
                    (this_00,(Instruction)((uVar2 & 0xff) << 0x10 | 0xf000000),
                     while_stmt->first_line_);
  AddLoopJumpInfo(this,&while_stmt->super_SyntaxTree,(int)sVar3,JumpTail);
  pSVar1 = (while_stmt->block_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,0);
  sVar3 = Function::AddInstruction(this_00,(Instruction)0x12000000,while_stmt->last_line_);
  AddLoopJumpInfo(this,&while_stmt->super_SyntaxTree,(int)sVar3,JumpHead);
  Guard::~Guard(&l);
  Guard::~Guard(&g);
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(WhileStatement *while_stmt, void *data)
    {
        CODE_GENERATE_GUARD(EnterBlock, LeaveBlock);
        LOOP_GUARD(while_stmt);

        auto register_id = GenerateRegisterId();
        ExpVarData exp_var_data{ register_id, register_id + 1 };
        while_stmt->exp_->Accept(this, &exp_var_data);

        // Jump to loop tail when expression is false
        auto function = GetCurrentFunction();
        auto instruction = Instruction::AsBxCode(OpType_JmpFalse, register_id, 0);
        int index = function->AddInstruction(instruction, while_stmt->first_line_);
        AddLoopJumpInfo(while_stmt, index, LoopJumpInfo::JumpTail);

        while_stmt->block_->Accept(this, nullptr);

        // Jump to loop head
        instruction = Instruction::AsBxCode(OpType_Jmp, 0, 0);
        index = function->AddInstruction(instruction, while_stmt->last_line_);
        AddLoopJumpInfo(while_stmt, index, LoopJumpInfo::JumpHead);
    }